

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

edata_t * extent_split_impl(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata,size_t size_a,
                           size_t size_b,_Bool holding_core_locks)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  void *pvVar4;
  _Bool _Var5;
  char cVar6;
  edata_t *edata_00;
  tsdn_t *tsdn_00;
  emap_prepare_t prepare;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar7;
  undefined1 in_stack_ffffffffffffff70;
  size_t sVar8;
  emap_prepare_t local_50;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if ((*(long *)((long)(ehooks->ptr).repr + 0x38) != 0) &&
     (edata_00 = duckdb_je_edata_cache_get(tsdn,pac->edata_cache), edata_00 != (edata_t *)0x0)) {
    uVar1 = (uint)edata->e_bits;
    edata_init(edata_00,uVar1 & 0xfff,(void *)(((ulong)edata->e_addr & 0xfffffffffffff000) + size_a)
               ,size_b,SUB81(edata->e_sn,0),uVar1 >> 0x11 & 7,
               CONCAT44(uVar7,(uVar1 & 0xffff) >> 0xf),uVar1 >> 0xd & extent_state_dirty,false,
               (_Bool)in_stack_ffffffffffffff70,(extent_pai_t)size_a,(extent_head_state_t)tsdn);
    sVar8 = size_a;
    tsdn_00 = tsdn;
    _Var5 = duckdb_je_emap_split_prepare(tsdn,pac->emap,&local_50,edata,size_a,edata_00,size_b);
    if (!_Var5) {
      pvVar2 = edata->e_addr;
      uVar3 = edata->e_bits;
      pvVar4 = (ehooks->ptr).repr;
      if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
        _Var5 = duckdb_je_ehooks_default_split_impl();
        tsdn = tsdn_00;
        if (!_Var5) {
LAB_01f9b0fb:
          (edata->field_2).e_size_esn = (uint)(edata->field_2).e_size_esn & 0xfff | size_a;
          duckdb_je_emap_split_commit(tsdn_00,pac->emap,&local_50,edata,size_a,edata_00,size_b);
          return edata_00;
        }
      }
      else {
        tsdn = tsdn_00;
        if (*(long *)((long)pvVar4 + 0x38) != 0) {
          size_a = sVar8;
          ehooks_pre_reentrancy(tsdn_00);
          cVar6 = (**(code **)((long)pvVar4 + 0x38))
                            (pvVar4,(ulong)pvVar2 & 0xfffffffffffff000,sVar8 + size_b,size_a,size_b,
                             (uint)(uVar3 >> 0xd) & 1,ehooks->ind);
          ehooks_post_reentrancy(tsdn_00);
          if (cVar6 == '\0') goto LAB_01f9b0fb;
        }
      }
    }
    duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata_00);
  }
  return (edata_t *)0x0;
}

Assistant:

static edata_t *
extent_split_impl(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata, size_t size_a, size_t size_b, bool holding_core_locks) {
	assert(edata_size_get(edata) == size_a + size_b);
	/* Only the shrink path may split w/o holding core locks. */
	if (holding_core_locks) {
		witness_assert_positive_depth_to_rank(
		    tsdn_witness_tsdp_get(tsdn), WITNESS_RANK_CORE);
	} else {
		witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
		    WITNESS_RANK_CORE, 0);
	}

	if (ehooks_split_will_fail(ehooks)) {
		return NULL;
	}

	edata_t *trail = edata_cache_get(tsdn, pac->edata_cache);
	if (trail == NULL) {
		goto label_error_a;
	}

	edata_init(trail, edata_arena_ind_get(edata),
	    (void *)((byte_t *)edata_base_get(edata) + size_a), size_b,
	    /* slab */ false, SC_NSIZES, edata_sn_get(edata),
	    edata_state_get(edata), edata_zeroed_get(edata),
	    edata_committed_get(edata), EXTENT_PAI_PAC, EXTENT_NOT_HEAD);
	emap_prepare_t prepare;
	bool err = emap_split_prepare(tsdn, pac->emap, &prepare, edata,
	    size_a, trail, size_b);
	if (err) {
		goto label_error_b;
	}

	/*
	 * No need to acquire trail or edata, because: 1) trail was new (just
	 * allocated); and 2) edata is either an active allocation (the shrink
	 * path), or in an acquired state (extracted from the ecache on the
	 * extent_recycle_split path).
	 */
	assert(emap_edata_is_acquired(tsdn, pac->emap, edata));
	assert(emap_edata_is_acquired(tsdn, pac->emap, trail));

	err = ehooks_split(tsdn, ehooks, edata_base_get(edata), size_a + size_b,
	    size_a, size_b, edata_committed_get(edata));

	if (err) {
		goto label_error_b;
	}

	edata_size_set(edata, size_a);
	emap_split_commit(tsdn, pac->emap, &prepare, edata, size_a, trail,
	    size_b);

	return trail;
label_error_b:
	edata_cache_put(tsdn, pac->edata_cache, trail);
label_error_a:
	return NULL;
}